

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

VkDescriptorBufferInfo * __thiscall
vkt::ubo::anon_unknown_0::UniformBlockCaseInstance::addUniformData
          (VkDescriptorBufferInfo *__return_storage_ptr__,UniformBlockCaseInstance *this,
          deUint32 size,void *dataPtr)

{
  Allocation *ptr;
  VkDevice device;
  DeviceInterface *vkd;
  Unique<vk::Handle<(vk::HandleType)8>_> *ptr_00;
  ulong bufferSize;
  SharedPtr<vk::Allocation> SStack_78;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  
  device = Context::getDevice((this->super_TestInstance).m_context);
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  bufferSize = (ulong)size;
  createBuffer(&buffer,(this->super_TestInstance).m_context,bufferSize,0x10);
  allocateAndBindMemory
            (&alloc,(this->super_TestInstance).m_context,
             (VkBuffer)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
             ,(MemoryRequirement)0x1);
  memcpy((alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,dataPtr,bufferSize);
  ::vk::flushMappedMemoryRange
            (vkd,device,
             (VkDeviceMemory)
             ((alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
              ptr)->m_memory).m_internal,
             (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
             )->m_offset,bufferSize);
  (__return_storage_ptr__->buffer).m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->range = bufferSize;
  ptr_00 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&SStack_78,ptr_00
            );
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
  ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
            ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
              *)&this->m_uniformBuffers,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&SStack_78);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::release
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&SStack_78);
  ptr = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  de::SharedPtr<vk::Allocation>::SharedPtr(&SStack_78,ptr);
  std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
  emplace_back<de::SharedPtr<vk::Allocation>>
            ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>> *)
             &this->m_uniformAllocs,&SStack_78);
  de::SharedPtr<vk::Allocation>::~SharedPtr(&SStack_78);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  return __return_storage_ptr__;
}

Assistant:

vk::VkDescriptorBufferInfo UniformBlockCaseInstance::addUniformData (deUint32 size, const void* dataPtr)
{
	const VkDevice					vkDevice			= m_context.getDevice();
	const DeviceInterface&			vk					= m_context.getDeviceInterface();

	Move<VkBuffer>					buffer	= createBuffer(m_context, size, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
	de::MovePtr<Allocation>			alloc	= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

	deMemcpy(alloc->getHostPtr(), dataPtr, size);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), size);

	const VkDescriptorBufferInfo			descriptor			=
	{
		*buffer,				// VkBuffer		buffer;
		0u,						// VkDeviceSize	offset;
		size,					// VkDeviceSize	range;

	};

	m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
	m_uniformAllocs.push_back(AllocationSp(alloc.release()));

	return descriptor;
}